

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O3

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context::
Context(Context *this,PIT *pit,DMA *dma,PPI *ppi,PIC *pic,type *card,FloppyController *fdc,RTC *rtc)

{
  Registers *pRVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  
  pRVar1 = &this->registers;
  (this->segments).registers_ = pRVar1;
  memset(&this->memory,0,0x100000);
  (this->memory).memory._M_elems[0] = 0xff;
  (this->memory).registers_ = pRVar1;
  (this->memory).segments_ = &this->segments;
  (this->memory).write_back_address_[0] = 0;
  (this->memory).write_back_address_[1] = 0;
  (this->flow_controller).registers_ = pRVar1;
  (this->flow_controller).segments_ = &this->segments;
  (this->flow_controller).should_repeat_ = false;
  (this->flow_controller).halted_ = false;
  (this->io).pit_ = pit;
  (this->io).dma_ = dma;
  (this->io).ppi_ = ppi;
  (this->io).pic_ = pic;
  (this->io).video_ = card;
  (this->io).fdc_ = fdc;
  (this->io).rtc_ = rtc;
  (this->registers).cs_ = 0xffff;
  (this->registers).ip_ = 0;
  (this->segments).es_base_ = (uint)(this->registers).es_ << 4;
  (this->segments).cs_base_ = 0xffff0;
  uVar2 = *(ulong *)&(this->registers).ds_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3._12_2_ = (short)(uVar2 >> 0x30);
  auVar4._8_2_ = (short)(uVar2 >> 0x20);
  auVar4._0_8_ = uVar2;
  auVar4._10_4_ = auVar3._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar4._8_6_;
  (this->segments).ds_base_ = (uint)(ushort)uVar2 << 4;
  (this->segments).ss_base_ = (int)CONCAT82(SUB148(auVar5 << 0x40,6),(short)(uVar2 >> 0x10)) << 4;
  return;
}

Assistant:

Context(PIT &pit, DMA &dma, PPI &ppi, PIC &pic, typename Adaptor<video>::type &card, FloppyController &fdc, RTC &rtc) :
				segments(registers),
				memory(registers, segments),
				flow_controller(registers, segments),
				io(pit, dma, ppi, pic, card, fdc, rtc)
			{
				reset();
			}